

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeKind_Basic.h
# Opt level: O0

bool psy::C::isRealTypeKind(BasicTypeKind *basicTyK)

{
  BasicTypeKind *basicTyK_local;
  
  return (byte)(*basicTyK - Char_S) < 0xe;
}

Assistant:

PSY_C_API inline bool isRealTypeKind(const BasicTypeKind& basicTyK)
{
    switch (basicTyK) {
        case BasicTypeKind::Char_U:
        case BasicTypeKind::Char_S:
        case BasicTypeKind::Short_U:
        case BasicTypeKind::Short_S:
        case BasicTypeKind::Int_U:
        case BasicTypeKind::Int_S:
        case BasicTypeKind::Long_U:
        case BasicTypeKind::Long_S:
        case BasicTypeKind::LongLong_U:
        case BasicTypeKind::LongLong_S:
        case BasicTypeKind::Bool:
        case BasicTypeKind::Float:
        case BasicTypeKind::Double:
        case BasicTypeKind::LongDouble:
            return true;
        default:
            return false;
    }
}